

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
Analyze(StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *this,
       ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  size_type __n;
  bool bVar3;
  bool bVar4;
  reference rVar5;
  
  if (parent == (ColumnWriterState *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) != 0
            || (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p !=
               (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
  }
  __n = (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1;
  if (bVar3) {
    count = ((long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1) - __n;
  }
  pdVar1 = vector->data;
  FlatVector::VerifyFlatVector(vector);
  if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 && !bVar3) {
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::Insert
                (*(PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                   **)(pdVar1 + iVar2 * 8),&state_p[2].definition_levels);
      state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
    }
  }
  else {
    iVar2 = 0;
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      if (bVar3) {
        rVar5 = vector<bool,_true>::get<true>(&parent->is_empty,__n);
        if ((*rVar5._M_p & rVar5._M_mask) == 0) goto LAB_01f18ff2;
      }
      else {
LAB_01f18ff2:
        bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar2);
        if (bVar4) {
          PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
          Insert(*(PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                   **)(pdVar1 + iVar2 * 8),&state_p[2].definition_levels);
          state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
        }
        iVar2 = iVar2 + 1;
      }
      __n = __n + 1;
    }
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}